

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

int __thiscall Fl_Window_Type::open(Fl_Window_Type *this,char *__file,int __oflag,...)

{
  Fl_Window *this_00;
  Fl_Widget *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  int __oflag_00;
  
  this_00 = (Fl_Window *)(this->super_Fl_Widget_Type).o;
  if (this_00->i == (Fl_X *)0x0) {
    pFVar1 = (this_00->super_Fl_Group).resizable_;
    if (pFVar1 == (Fl_Widget *)0x0) {
      (this_00->super_Fl_Group).resizable_ = (Fl_Widget *)this_00;
      (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this_00,__file,___oflag);
      (this_00->super_Fl_Group).resizable_ = (Fl_Widget *)0x0;
    }
    else {
      (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this_00);
      (this_00->super_Fl_Group).resizable_ = pFVar1;
    }
  }
  else {
    (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this_00);
    Fl_Widget_Type::open(&this->super_Fl_Widget_Type,__file,__oflag_00);
  }
  (this_00->super_Fl_Group).super_Fl_Widget.label_.image = Fl::scheme_bg_;
  iVar4 = gridy;
  iVar2 = gridx;
  iVar6 = Fl::w();
  iVar7 = Fl::h();
  iVar5 = gridy;
  iVar3 = gridx;
  this_00->minw = iVar2;
  this_00->minh = iVar4;
  this_00->maxw = iVar6;
  this_00->maxh = iVar7;
  this_00->dw = iVar3;
  this_00->dh = iVar5;
  this_00->aspect = 0;
  Fl_Window::size_range_(this_00);
  return extraout_EAX;
}

Assistant:

void Fl_Window_Type::open() {
  Overlay_Window *w = (Overlay_Window *)o;
  if (w->shown()) {
    w->show();
    Fl_Widget_Type::open();
  } else {
    Fl_Widget *p = w->resizable();
    if (!p) w->resizable(w);
    w->show();
    w->resizable(p);
  }

  w->image(Fl::scheme_bg_);
  w->size_range(gridx, gridy, Fl::w(), Fl::h(), gridx, gridy, 0);
}